

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::emplace<QTimeZone::OffsetData>
          (QMovableArrayOps<QTimeZone::OffsetData> *this,qsizetype i,OffsetData *args)

{
  OffsetData **ppOVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  OffsetData *pOVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  int iVar8;
  OffsetData *__dest;
  QDateTime *this_00;
  long in_FS_OFFSET;
  bool bVar9;
  Data local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
           super_QArrayDataPointer<QTimeZone::OffsetData>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00352866:
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    pDVar6 = (args->abbreviation).d.d;
    pcVar7 = (args->abbreviation).d.ptr;
    (args->abbreviation).d.d = (Data *)0x0;
    (args->abbreviation).d.ptr = (char16_t *)0x0;
    qVar5 = (args->abbreviation).d.size;
    (args->abbreviation).d.size = 0;
    QDateTime::QDateTime((QDateTime *)&local_50.data,&args->atUtc);
    local_40 = (undefined1 *)CONCAT44(local_40._4_4_,args->daylightTimeOffset);
    puStack_48._0_4_ = args->offsetFromUtc;
    puStack_48._4_4_ = args->standardTimeOffset;
    bVar9 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
            super_QArrayDataPointer<QTimeZone::OffsetData>.size != 0;
    QArrayDataPointer<QTimeZone::OffsetData>::detachAndGrow
              ((QArrayDataPointer<QTimeZone::OffsetData> *)this,(uint)(i == 0 && bVar9),1,
               (OffsetData **)0x0,(QArrayDataPointer<QTimeZone::OffsetData> *)0x0);
    pOVar4 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
             super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
    if (i == 0 && bVar9) {
      pOVar4[-1].abbreviation.d.d = pDVar6;
      pOVar4[-1].abbreviation.d.ptr = pcVar7;
      pOVar4[-1].abbreviation.d.size = qVar5;
      QDateTime::QDateTime(&pOVar4[-1].atUtc,(QDateTime *)&local_50.data);
      pOVar4[-1].daylightTimeOffset = (int)local_40;
      *(undefined1 **)&pOVar4[-1].offsetFromUtc = puStack_48;
      ppOVar1 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
      *ppOVar1 = *ppOVar1 + -1;
    }
    else {
      __dest = pOVar4 + i + 1;
      memmove(__dest,pOVar4 + i,
              ((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
               super_QArrayDataPointer<QTimeZone::OffsetData>.size - i) * 0x30);
      __dest[-1].abbreviation.d.d = pDVar6;
      __dest[-1].abbreviation.d.ptr = pcVar7;
      __dest[-1].abbreviation.d.size = qVar5;
      this_00 = &pOVar4[i].atUtc;
      QDateTime::QDateTime(this_00,(QDateTime *)&local_50.data);
      *(int *)(this_00 + 2) = (int)local_40;
      this_00[1] = (QDateTime)puStack_48;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
              super_QArrayDataPointer<QTimeZone::OffsetData>.size;
    *pqVar2 = *pqVar2 + 1;
    QDateTime::~QDateTime((QDateTime *)&local_50.data);
  }
  else {
    if (((this->super_QGenericArrayOps<QTimeZone::OffsetData>).
         super_QArrayDataPointer<QTimeZone::OffsetData>.size == i) &&
       (pOVar4 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pOVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar6 = (args->abbreviation).d.d;
      (args->abbreviation).d.d = (Data *)0x0;
      pOVar4 = pOVar4 + i;
      (pOVar4->abbreviation).d.d = pDVar6;
      pcVar7 = (args->abbreviation).d.ptr;
      (args->abbreviation).d.ptr = (char16_t *)0x0;
      (pOVar4->abbreviation).d.ptr = pcVar7;
      qVar5 = (args->abbreviation).d.size;
      (args->abbreviation).d.size = 0;
      (pOVar4->abbreviation).d.size = qVar5;
      QDateTime::QDateTime(&pOVar4->atUtc,&args->atUtc);
      pOVar4->daylightTimeOffset = args->daylightTimeOffset;
      iVar8 = args->standardTimeOffset;
      pOVar4->offsetFromUtc = args->offsetFromUtc;
      pOVar4->standardTimeOffset = iVar8;
    }
    else {
      if ((i != 0) ||
         (pOVar4 = (this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                   super_QArrayDataPointer<QTimeZone::OffsetData>.ptr,
         (OffsetData *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pOVar4)) goto LAB_00352866;
      pDVar6 = (args->abbreviation).d.d;
      (args->abbreviation).d.d = (Data *)0x0;
      pOVar4[-1].abbreviation.d.d = pDVar6;
      pcVar7 = (args->abbreviation).d.ptr;
      (args->abbreviation).d.ptr = (char16_t *)0x0;
      pOVar4[-1].abbreviation.d.ptr = pcVar7;
      qVar5 = (args->abbreviation).d.size;
      (args->abbreviation).d.size = 0;
      pOVar4[-1].abbreviation.d.size = qVar5;
      QDateTime::QDateTime(&pOVar4[-1].atUtc,&args->atUtc);
      pOVar4[-1].daylightTimeOffset = args->daylightTimeOffset;
      iVar8 = args->standardTimeOffset;
      pOVar4[-1].offsetFromUtc = args->offsetFromUtc;
      pOVar4[-1].standardTimeOffset = iVar8;
      ppOVar1 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
                 super_QArrayDataPointer<QTimeZone::OffsetData>.ptr;
      *ppOVar1 = *ppOVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTimeZone::OffsetData>).
              super_QArrayDataPointer<QTimeZone::OffsetData>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }